

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O2

Var __thiscall Js::JavascriptRegExp::GetOptions(JavascriptRegExp *this)

{
  ScriptContext *this_00;
  bool bVar1;
  TempArenaAllocatorObject *tempAllocator;
  char16 *content;
  JavascriptString *pJVar2;
  undefined1 local_58 [8];
  StringBuilder<Memory::ArenaAllocator> bs;
  
  this_00 = (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr
             )->super_JavascriptLibraryBase).scriptContext.ptr;
  tempAllocator = ScriptContext::GetTemporaryAllocator(this_00,L"JavascriptRegExp");
  local_58 = (undefined1  [8])&tempAllocator->allocator;
  bs.alloc = (ArenaAllocator *)0x0;
  bs.firstChunk = (Data *)0x0;
  bs.lastChunk = (Data *)0x0;
  bs.appendPtr = (char16 *)0x0;
  bs.count = 4;
  bVar1 = UnifiedRegex::RegexPattern::IsGlobal((this->pattern).ptr);
  if (bVar1) {
    StringBuilder<Memory::ArenaAllocator>::Append
              ((StringBuilder<Memory::ArenaAllocator> *)local_58,L'g');
  }
  bVar1 = UnifiedRegex::RegexPattern::IsIgnoreCase((this->pattern).ptr);
  if (bVar1) {
    StringBuilder<Memory::ArenaAllocator>::Append
              ((StringBuilder<Memory::ArenaAllocator> *)local_58,L'i');
  }
  bVar1 = UnifiedRegex::RegexPattern::IsMultiline((this->pattern).ptr);
  if (bVar1) {
    StringBuilder<Memory::ArenaAllocator>::Append
              ((StringBuilder<Memory::ArenaAllocator> *)local_58,L'm');
  }
  bVar1 = UnifiedRegex::RegexPattern::IsDotAll((this->pattern).ptr);
  if (bVar1) {
    StringBuilder<Memory::ArenaAllocator>::Append
              ((StringBuilder<Memory::ArenaAllocator> *)local_58,L's');
  }
  bVar1 = UnifiedRegex::RegexPattern::IsUnicode((this->pattern).ptr);
  if (bVar1) {
    StringBuilder<Memory::ArenaAllocator>::Append
              ((StringBuilder<Memory::ArenaAllocator> *)local_58,L'u');
  }
  bVar1 = UnifiedRegex::RegexPattern::IsSticky((this->pattern).ptr);
  if (bVar1) {
    StringBuilder<Memory::ArenaAllocator>::Append
              ((StringBuilder<Memory::ArenaAllocator> *)local_58,L'y');
  }
  content = StringBuilder<Memory::ArenaAllocator>::Detach
                      ((StringBuilder<Memory::ArenaAllocator> *)local_58);
  pJVar2 = JavascriptString::NewCopyBuffer(content,bs.appendPtr._4_4_,this_00);
  ScriptContext::ReleaseTemporaryAllocator(this_00,tempAllocator);
  return pJVar2;
}

Assistant:

Var JavascriptRegExp::GetOptions()
    {
        Var options;

        ScriptContext* scriptContext = this->GetLibrary()->GetScriptContext();
        BEGIN_TEMP_ALLOCATOR(tempAlloc, scriptContext, _u("JavascriptRegExp"))
        {
            StringBuilder<ArenaAllocator> bs(tempAlloc, 4);

            // If you change the order of the flags, don't forget to change it in EntryGetterFlags() and ToString() too.
            if(GetPattern()->IsGlobal())
            {
                bs.Append(_u('g'));
            }
            if(GetPattern()->IsIgnoreCase())
            {
                bs.Append(_u('i'));
            }
            if(GetPattern()->IsMultiline())
            {
                bs.Append(_u('m'));
            }
            if(GetPattern()->IsDotAll())
            {
                bs.Append(_u('s'));
            }
            if (GetPattern()->IsUnicode())
            {
                bs.Append(_u('u'));
            }
            if (GetPattern()->IsSticky())
            {
                bs.Append(_u('y'));
            }
            options = Js::JavascriptString::NewCopyBuffer(bs.Detach(), bs.Count(), scriptContext);
        }
        END_TEMP_ALLOCATOR(tempAlloc, scriptContext);

        return options;
    }